

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

void lj_buf_shrink(lua_State *L,SBuf *sb)

{
  uint uVar1;
  uint osz_00;
  GCSize nsz;
  void *pvVar2;
  uint32_t uVar3;
  lua_State *in_RSI;
  MSize n;
  MSize osz;
  char *b;
  
  uVar1 = (in_RSI->glref).ptr32;
  osz_00 = *(int *)&in_RSI->marked - uVar1;
  if (0x40 < osz_00) {
    nsz = (in_RSI->nextgc).gcptr32 - uVar1;
    pvVar2 = lj_mem_realloc(in_RSI,(void *)(ulong)uVar1,osz_00,nsz);
    uVar3 = (uint32_t)pvVar2;
    (in_RSI->glref).ptr32 = uVar3;
    (in_RSI->nextgc).gcptr32 = uVar3 + nsz;
    *(uint32_t *)&in_RSI->marked = uVar3 + (osz_00 >> 1);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_buf_shrink(lua_State *L, SBuf *sb)
{
  char *b = sbufB(sb);
  MSize osz = (MSize)(sbufE(sb) - b);
  if (osz > 2*LJ_MIN_SBUF) {
    MSize n = (MSize)(sbufP(sb) - b);
    b = lj_mem_realloc(L, b, osz, (osz >> 1));
    setmref(sb->b, b);
    setmref(sb->p, b + n);
    setmref(sb->e, b + (osz >> 1));
  }
}